

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O2

void __thiscall BS::thread_pool::worker(thread_pool *this)

{
  unique_lock<std::mutex> tasks_lock;
  function<void_()> task;
  unique_lock<std::mutex> local_68;
  _Any_data local_58;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  while (((this->running)._M_base._M_i & 1U) != 0) {
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    uStack_48 = 0;
    uStack_40 = 0;
    std::unique_lock<std::mutex>::unique_lock(&local_68,&this->tasks_mutex);
    std::condition_variable::wait<BS::thread_pool::worker()::_lambda()_1_>
              (&this->task_available_cv,&local_68,(anon_class_8_1_8991fb9c)this);
    if ((((this->running)._M_base._M_i & 1U) != 0) && (((this->paused)._M_base._M_i & 1U) == 0)) {
      std::function<void_()>::operator=
                ((function<void_()> *)&local_58,
                 (this->tasks).c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                (&(this->tasks).c);
      std::unique_lock<std::mutex>::unlock(&local_68);
      std::function<void_()>::operator()((function<void_()> *)&local_58);
      std::unique_lock<std::mutex>::lock(&local_68);
      LOCK();
      (this->tasks_total).super___atomic_base<unsigned_long>._M_i =
           (this->tasks_total).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      if (((this->waiting)._M_base._M_i & 1U) != 0) {
        std::condition_variable::notify_one();
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
  }
  return;
}

Assistant:

void worker()
    {
        while (running)
        {
            std::function<void()> task;
            std::unique_lock<std::mutex> tasks_lock(tasks_mutex);
            task_available_cv.wait(tasks_lock, [this] { return !tasks.empty() || !running; });
            if (running && !paused)
            {
                task = std::move(tasks.front());
                tasks.pop();
                tasks_lock.unlock();
                task();
                tasks_lock.lock();
                --tasks_total;
                if (waiting)
                    task_done_cv.notify_one();
            }
        }
    }